

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemorySize
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemorySize *curr)

{
  char **__return_storage_ptr___00;
  Address x;
  Memory *pMVar1;
  undefined1 local_50 [8];
  MemoryInstanceInfo info;
  
  getMemoryInstanceInfo((MemoryInstanceInfo *)local_50,this,(Name)(curr->memory).super_IString.str);
  x = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_50,(Name)info._0_16_);
  pMVar1 = Module::getMemory(*(Module **)((long)local_50 + 0x20),(Name)info._0_16_);
  __return_storage_ptr___00 = &info.name.super_IString.str._M_str;
  Literal::makeFromInt64((Literal *)__return_storage_ptr___00,x.addr,(Type)(pMVar1->indexType).id);
  Flow::Flow(__return_storage_ptr__,(Literal *)__return_storage_ptr___00);
  Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemorySize(MemorySize* curr) {
    NOTE_ENTER("MemorySize");
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto* memory = info.instance->wasm.getMemory(info.name);
    return Literal::makeFromInt64(memorySize, memory->indexType);
  }